

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::OneHotLayerParams::SerializeWithCachedSizes
          (OneHotLayerParams *this,CodedOutputStream *output)

{
  float fVar1;
  
  if (this->onehotvectorsize_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(1,this->onehotvectorsize_,output);
  }
  if (this->axis_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(2,this->axis_,output);
  }
  fVar1 = this->onvalue_;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    google::protobuf::internal::WireFormatLite::WriteFloat(3,fVar1,output);
  }
  fVar1 = this->offvalue_;
  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
    return;
  }
  google::protobuf::internal::WireFormatLite::WriteFloat(4,fVar1,output);
  return;
}

Assistant:

void OneHotLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.OneHotLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint64 oneHotVectorSize = 1;
  if (this->onehotvectorsize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(1, this->onehotvectorsize(), output);
  }

  // int64 axis = 2;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(2, this->axis(), output);
  }

  // float onValue = 3;
  if (this->onvalue() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(3, this->onvalue(), output);
  }

  // float offValue = 4;
  if (this->offvalue() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(4, this->offvalue(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.OneHotLayerParams)
}